

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

bool __thiscall
flow_cutter::
SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
::advance(SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
          *this)

{
  GraphSearchAlgorithm GVar1;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  *pGVar2;
  bool bVar3;
  runtime_error *this_00;
  BreadthFirstSearch local_55;
  PierceNodeScore local_54;
  
  GVar1 = (this->config).graph_search_algorithm;
  if (GVar1 == pseudo_depth_first_search) {
    pGVar2 = this->graph;
    PierceNodeScore::PierceNodeScore(&local_54,this->config);
    bVar3 = MultiCutter::
            advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>
                      (&this->cutter,pGVar2,&this->tmp,(PseudoDepthFirstSearch *)&local_55,&local_54
                       ,(this->config).skip_non_maximum_sides == skip);
  }
  else if (GVar1 == breadth_first_search) {
    pGVar2 = this->graph;
    PierceNodeScore::PierceNodeScore(&local_54,this->config);
    bVar3 = MultiCutter::
            advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>
                      (&this->cutter,pGVar2,&this->tmp,&local_55,&local_54,
                       (this->config).skip_non_maximum_sides == skip);
  }
  else {
    if (GVar1 == depth_first_search) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"depth first search is not yet implemented");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool advance()
    {

        switch (config.graph_search_algorithm) {
        case Config::GraphSearchAlgorithm::pseudo_depth_first_search:
            return cutter.advance(
                graph, tmp, PseudoDepthFirstSearch(), PierceNodeScore(config),
                config.skip_non_maximum_sides == Config::SkipNonMaximumSides::skip);

        case Config::GraphSearchAlgorithm::breadth_first_search:
            return cutter.advance(
                graph, tmp, BreadthFirstSearch(), PierceNodeScore(config),
                config.skip_non_maximum_sides == Config::SkipNonMaximumSides::skip);

        case Config::GraphSearchAlgorithm::depth_first_search:
            throw std::runtime_error("depth first search is not yet implemented");
        default:
            assert(false);
            return false;
        }
    }